

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_handler.cpp
# Opt level: O0

void __thiscall ProtoHandler::OnAddBreakPointReq(ProtoHandler *this,AddBreakpointParams *params)

{
  bool bVar1;
  EmmyDebuggerManager *this_00;
  shared_ptr<BreakPoint> local_50;
  reference local_40;
  shared_ptr<BreakPoint> *bp;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_> *__range1;
  EmmyDebuggerManager *manager;
  AddBreakpointParams *params_local;
  ProtoHandler *this_local;
  
  this_00 = EmmyFacade::GetDebugManager(this->_owner);
  if ((params->clear & 1U) != 0) {
    EmmyDebuggerManager::RemoveAllBreakpoints(this_00);
  }
  __end1 = std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::
           begin(&params->breakPoints);
  bp = (shared_ptr<BreakPoint> *)
       std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>::end
                 (&params->breakPoints);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
                                *)&bp);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
               ::operator*(&__end1);
    std::shared_ptr<BreakPoint>::shared_ptr(&local_50,local_40);
    EmmyDebuggerManager::AddBreakpoint(this_00,&local_50);
    std::shared_ptr<BreakPoint>::~shared_ptr(&local_50);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<BreakPoint>_*,_std::vector<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ProtoHandler::OnAddBreakPointReq(AddBreakpointParams &params) {
	auto &manager = _owner->GetDebugManager();
	if (params.clear) {
		manager.RemoveAllBreakpoints();
	}

	for (auto &bp: params.breakPoints) {
		manager.AddBreakpoint(bp);
	}
}